

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

djg_mesh * djgm_load_plane(int slices,int stacks)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  djg_mesh *__ptr;
  djgm_vertex *pdVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  undefined2 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint16_t *puVar11;
  djgm_vertex *pdVar12;
  ulong uVar13;
  djgm_vertex *pdVar14;
  long lVar15;
  ulong uVar16;
  short sVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  uint16_t uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  
  __ptr = (djg_mesh *)malloc(0x28);
  if (__ptr == (djg_mesh *)0x0) {
    __assert_fail("mesh",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x5fc,"djg_mesh *djgm__create()");
  }
  __ptr->poly4v = (uint16_t *)0x0;
  __ptr->vertexc = 0;
  __ptr->poly3c = 0;
  __ptr->vertexv = (djgm_vertex *)0x0;
  __ptr->poly3v = (uint16_t *)0x0;
  __ptr->poly4c = 0;
  if (-1 < (stacks | slices)) {
    uVar1 = stacks + 2;
    uVar8 = uVar1 * (slices + 2U);
    if ((int)uVar8 < 0x10000) {
      pdVar4 = (djgm_vertex *)malloc((ulong)uVar8 << 6);
      if (-2 < slices) {
        uVar10 = 0;
        pdVar12 = pdVar4;
        do {
          if (-2 < stacks) {
            fVar25 = (float)(int)uVar10 / (float)(slices + 1);
            uVar18 = 0;
            pdVar14 = pdVar12;
            do {
              (pdVar14->st).s = fVar25;
              fVar26 = (float)(int)uVar18 / (float)(stacks + 1);
              (pdVar14->st).t = fVar26;
              (pdVar14->st).p = 0.0;
              (pdVar14->st).q = 0.0;
              (pdVar14->p).x = fVar25;
              (pdVar14->p).y = fVar26;
              (pdVar14->p).z = 0.0;
              (pdVar14->p).w = 1.0;
              (pdVar14->dpds).x = 1.0;
              (pdVar14->dpds).y = 0.0;
              (pdVar14->dpds).z = 0.0;
              *(undefined8 *)&(pdVar14->dpds).w = 0;
              (pdVar14->dpdt).y = 1.0;
              (pdVar14->dpdt).z = 0.0;
              (pdVar14->dpdt).w = 0.0;
              uVar18 = uVar18 + 1;
              pdVar14 = pdVar14 + 1;
            } while (uVar1 != uVar18);
          }
          uVar10 = uVar10 + 1;
          pdVar12 = pdVar12 + (int)uVar1;
        } while (uVar10 != slices + 2U);
      }
      __ptr->vertexv = pdVar4;
      __ptr->vertexc = uVar8;
    }
    else {
      fwrite("djg_error: Too many vertices\n",0x1d,1,_stdout);
      fflush(_stdout);
    }
    if ((int)uVar8 < 0x10000) {
      uVar8 = stacks + 1;
      iVar20 = uVar8 * (slices + 1U);
      uVar3 = iVar20 * 6;
      uVar21 = iVar20 * 4;
      puVar5 = (uint16_t *)malloc((ulong)uVar3 * 2);
      puVar6 = (uint16_t *)malloc((ulong)uVar21 * 2);
      if (-1 < stacks) {
        uVar10 = (ulong)(slices + 1U);
        sVar2 = (short)stacks + 3;
        puVar11 = puVar5 + 5;
        uVar18 = 0;
        do {
          if (-1 < slices) {
            uVar13 = uVar18 & 0xffffffff;
            lVar15 = 0;
            do {
              sVar17 = (short)uVar13;
              *(short *)((long)puVar11 + lVar15 + -10) = sVar17;
              uVar9 = (int)uVar13 + uVar1;
              uVar7 = (undefined2)uVar9;
              *(undefined2 *)((long)puVar11 + lVar15 + -8) = uVar7;
              *(short *)((long)puVar11 + lVar15 + -6) = sVar17 + 1;
              *(short *)((long)puVar11 + lVar15 + -4) = sVar17 + 1;
              *(undefined2 *)((long)puVar11 + lVar15 + -2) = uVar7;
              *(short *)((long)puVar11 + lVar15) = sVar17 + sVar2;
              lVar15 = lVar15 + 0xc;
              uVar13 = (ulong)uVar9;
            } while (uVar10 * 0xc != lVar15);
          }
          uVar18 = uVar18 + 1;
          puVar11 = puVar11 + uVar10 * 6;
        } while (uVar18 != uVar8);
        if (-1 < stacks) {
          uVar18 = 0;
          uVar13 = 0;
          do {
            if (-1 < slices) {
              uVar24 = uVar13 & 0xffffffff;
              uVar16 = uVar18;
              uVar19 = uVar10;
              do {
                uVar22 = uVar16 & 0xffffffff;
                uVar23 = (uint16_t)uVar24;
                puVar6[uVar22] = uVar23;
                uVar9 = (int)uVar24 + uVar1;
                puVar6[uVar22 + 1] = (uint16_t)uVar9;
                puVar6[uVar22 + 2] = sVar2 + uVar23;
                puVar6[uVar22 + 3] = uVar23 + 1;
                uVar16 = uVar16 + 4;
                uVar24 = (ulong)uVar9;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
            }
            uVar13 = uVar13 + 1;
            uVar18 = uVar18 + uVar10 * 4;
          } while (uVar13 != uVar8);
        }
      }
      __ptr->poly3c = uVar3;
      __ptr->poly4c = uVar21;
      __ptr->poly3v = puVar5;
      __ptr->poly4v = puVar6;
    }
    else {
      free(__ptr);
      __ptr = (djg_mesh *)0x0;
    }
    return __ptr;
  }
  __assert_fail("slices >= 0 && stacks >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x674,"djg_mesh *djgm_load_plane(int, int)");
}

Assistant:

DJGDEF djg_mesh *
djgm_load_plane(int slices, int stacks)
{
    djg_mesh *mesh = djgm__create();

    DJG_ASSERT(slices >= 0 && stacks >= 0);
    if (!djgm__load_plane_vertices(mesh, slices, stacks)) {
        DJG_FREE(mesh);

        return NULL;
    }
    if (!djgm__load_plane_polygons(mesh, slices, stacks)) {
        DJG_FREE(mesh->vertexv);
        DJG_FREE(mesh);

        return NULL;
    }

    return mesh;
}